

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

Cleanup<std::function<void_()>_> *
fork_torture::setup_fork_testing
          (Cleanup<std::function<void_()>_> *__return_storage_ptr__,int *argc,char ***argv)

{
  char *__lhs;
  int iVar1;
  thread *this;
  long *plVar2;
  bool local_1da;
  anon_class_1_0_00000001 local_1d9;
  function<void_()> local_1d8;
  type local_1b1;
  thread *local_1b0;
  thread *t;
  sigaction sa;
  size_t __cpu;
  cpu_set_t mask;
  function<void_()> local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char ***local_20;
  char ***argv_local;
  int *argc_local;
  
  local_42 = 0;
  local_55 = 0;
  local_1da = true;
  local_20 = argv;
  argv_local = (char ***)argc;
  argc_local = (int *)__return_storage_ptr__;
  if (1 < *argc) {
    __lhs = (*argv)[1];
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"--with-fork-torture",&local_41);
    local_55 = 1;
    local_1da = std::operator!=(__lhs,&local_40);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  if (local_1da == false) {
    printf("Enabling fork torturing!!!!\n");
    iVar1 = sem_init((sem_t *)single_step_req,0,0);
    if (iVar1 != 0) {
      syscall(1,2,"Check failed: sem_init(&single_step_req, 0, 0) == 0\n",0x34);
      abort();
    }
    iVar1 = sem_init((sem_t *)single_step_ack,0,0);
    if (iVar1 != 0) {
      syscall(1,2,"Check failed: sem_init(&single_step_ack, 0, 0) == 0\n",0x34);
      abort();
    }
    memset(&__cpu,0,0x80);
    sa.sa_restorer = (_func_void *)(__cpu | 1);
    __cpu = (size_t)sa.sa_restorer;
    iVar1 = sched_setaffinity(0,0x80,(cpu_set_t *)&__cpu);
    if (iVar1 != 0) {
      syscall(1,2,"Check failed: sched_setaffinity(0, sizeof(mask), &mask) == 0\n",0x3d);
      abort();
    }
    memset(&t,0,0x98);
    t = (thread *)step_handler;
    sa.sa_mask.__val[0xf]._0_4_ = 0x10000004;
    iVar1 = sigaction(5,(sigaction *)&t,(sigaction *)0x0);
    if (iVar1 != 0) {
      syscall(1,2,"Check failed: sigaction(SIGTRAP, &sa, nullptr) == 0\n",0x34);
      abort();
    }
    this = (thread *)operator_new(8);
    std::thread::thread<fork_torture::setup_fork_testing(int*,char***)::__2,,void>(this,&local_1b1);
    local_1b0 = this;
    xsem_wait((sem_t *)single_step_ack);
    plVar2 = (long *)MallocExtension::instance();
    (**(code **)(*plVar2 + 0x68))();
    raise(5);
    running_fork_testing = true;
    std::function<void()>::function<fork_torture::setup_fork_testing(int*,char***)::__1,void>
              ((function<void()> *)&local_1d8,&local_1d9);
    tcmalloc::Cleanup<std::function<void_()>_>::Cleanup(__return_storage_ptr__,&local_1d8);
    std::function<void_()>::~function(&local_1d8);
  }
  else {
    printf("Not enabling fork torture\n");
    std::function<void()>::function<fork_torture::setup_fork_testing(int*,char***)::__0,void>
              ((function<void()> *)&local_78,(anon_class_1_0_00000001 *)((long)mask.__bits + 0x7f));
    tcmalloc::Cleanup<std::function<void_()>_>::Cleanup(__return_storage_ptr__,&local_78);
    std::function<void_()>::~function(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

tcmalloc::Cleanup<std::function<void()>> setup_fork_testing(int* argc, char *** argv) {
  if (*argc < 2 || (*argv)[1] != std::string("--with-fork-torture")) {
    printf("Not enabling fork torture\n");
    return tcmalloc::Cleanup(std::function<void()>([] () {}));
  }
  printf("Enabling fork torturing!!!!\n");

  CHECK(sem_init(&single_step_req, 0, 0) == 0);
  CHECK(sem_init(&single_step_ack, 0, 0) == 0);

  // First, we set cpu affinity mask to only core 0. It helps
  // performance, but mostly it is required so that main thread never
  // runs when real-time helper thread is runnable.
  {
    cpu_set_t mask;
    memset(&mask, 0, sizeof(mask));
    CPU_SET(0, &mask);
    CHECK(sched_setaffinity(0, sizeof(mask), &mask) == 0);
  }

  // Then we prepare SIGTRAP signal handler.
  {
    struct sigaction sa;
    memset(&sa, 0, sizeof(sa));
    sa.sa_sigaction = step_handler;
    sa.sa_flags = SA_RESTART | SA_SIGINFO;
    CHECK(sigaction(SIGTRAP, &sa, nullptr) == 0);
  }

  std::thread* t = new std::thread([] () {
    // Helper thread first makes itself real-time.
    struct sched_param p;
    memset(&p, 0, sizeof(p));
    p.sched_priority = 1;
    CHECK(sched_setscheduler(0, SCHED_FIFO, &p) == 0);

    // And then signals its readiness.
    sem_post(&single_step_ack);

    MallocExtension::instance()->MarkThreadIdle();

    constexpr int kPeriod = 1 << 10;
    int cnt = kPeriod;

    while (true) {
      xsem_wait(&single_step_req);
      // Lets print something every few iterations to help us see if
      // progress is being made.
      if (--cnt <= 0) {
        write(2, "$", 1);
        cnt = kPeriod;
      }

      // Once we're about to fork, we need to flag "in_fork" mode and
      // unblock main thread.
      in_fork = true;
      sem_post(&single_step_ack);

      int child = fork();
      CHECK(child >= 0);
      if (child == 0) {
        // Child runs some mallocs and exits.
        (::operator delete)((::operator new)(32));
        (::operator delete)((::operator new)(1024));
        (::operator delete)((::operator new)(2 << 20));
        _exit(0);
      }

      // Parent asserts that child exited cleanly.
      int status = 0;
      int ret = waitpid(child, &status, 0);
      CHECK(ret == child);
      CHECK(status == 0);

      // And we un-mark in_fork mode, so that main thread continues to
      // cooperation via sem_{post/wait} on single_step_{req,ack}
      // semaphores.
      num_forks++;
      in_fork = false;
    }
  });
  (void)t; // leak
  xsem_wait(&single_step_ack);

  MallocExtension::instance()->MarkThreadIdle();

  // First SIGTRAP runs the signal handler and signal handler sets up
  // EFLAGS to single-step.
  raise(SIGTRAP);

  // This is a flag for a test that is not compatible with
  // single-stepping. NewHandler test doesn't work because it enables
  // oom simulation at some point which, naturally, crashes the forked
  // child.
  running_fork_testing = true;

  return tcmalloc::Cleanup(std::function<void()>([] () {
    stepping_stop_requested = true;
    while (!*const_cast<volatile bool*>(&stepping_stop_acked)) {
      // no-op
    }
    // In the clean up, we're ensuring that in_fork turns to false, so
    // that fork/waitpid isn't stuck.
    printf("Done with fork torturing! Number of forks performed: %lld\n", (long long)num_forks);
  }));
}